

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void SubtractionHelper<int,unsigned_long,10>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int *lhs,unsigned_long *rhs,int *result)

{
  ulong uVar1;
  uint32_t uVar2;
  int *in_RDX;
  ulong *in_RSI;
  int *in_RDI;
  uint64_t AbsMinIntT;
  
  if (*in_RDI < 0) {
    uVar1 = *in_RSI;
    uVar2 = AbsValueHelper<int,_0>::Abs(0);
    if (0x80000000 - (ulong)uVar2 < uVar1) {
LAB_001c9362:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - (int)*in_RSI;
  }
  else {
    if ((long)*in_RDI + 0x80000000U < *in_RSI) goto LAB_001c9362;
    *in_RDX = *in_RDI - (int)*in_RSI;
  }
  return;
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}